

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Copysign_f32(w3Interp *this)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = w3Stack::pop_f32(&this->super_w3Stack);
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  fVar3 = *pfVar1;
  if (0.0 <= fVar3 == fVar2 < 0.0) {
    fVar3 = -fVar3;
  }
  *pfVar1 = fVar3;
  return;
}

Assistant:

INTERP (Copysign_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = ((z2 < 0) != (z1 < 0)) ? -z1 : z1;
}